

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::TextureDecodeEnabledCase::setupTest
          (TextureDecodeEnabledCase *this)

{
  Vec4 local_a0;
  undefined1 local_90 [8];
  FragmentShaderParameters shaderParameters;
  TextureDecodeEnabledCase *this_local;
  
  shaderParameters.uniformsToToggle.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  FragmentShaderParameters::FragmentShaderParameters
            ((FragmentShaderParameters *)local_90,SHADEROUTPUTS_ONE,SHADERUNIFORMS_ONE,
             (ComparisonFunction *)0x0,BLENDING_NOT_REQUIRED,TOGGLING_NOT_REQUIRED);
  getColorReferenceLinear();
  SRGBTestCase::addTexture
            (&this->super_SRGBTestCase,TEXTURETYPE_2D,0x80,0x80,&local_a0,MIRRORED_REPEAT_GL,
             MIRRORED_REPEAT_GL,LINEAR,LINEAR,SRGBDECODE_DECODE);
  SRGBTestCase::addShaderProgram(&this->super_SRGBTestCase,(FragmentShaderParameters *)local_90);
  SRGBTestCase::setSamplingLocations(&this->super_SRGBTestCase,0,0);
  SRGBTestCase::setSamplingGroup(&this->super_SRGBTestCase,SHADERSAMPLINGGROUP_TEXTURE);
  FragmentShaderParameters::~FragmentShaderParameters((FragmentShaderParameters *)local_90);
  return;
}

Assistant:

void TextureDecodeEnabledCase::setupTest (void)
{
	// TEST STEPS:
	//	- create and set texture to DECODE_EXT
	//	- store texture on GPU
	//	- in fragment shader, sample the texture using texture*() and render texel values to a color attachment in the FBO
	//	- on the host, read back the pixel values into a tcu::TextureLevel
	//	- analyse the texel values, expecting them in lRGB format i.e. linear space decoding was enabled

	FragmentShaderParameters shaderParameters(SHADEROUTPUTS_ONE, SHADERUNIFORMS_ONE, NULL, BLENDING_NOT_REQUIRED, TOGGLING_NOT_REQUIRED);

	this->addTexture(	TEXTURETYPE_2D,
						TestDimensions::WIDTH,
						TestDimensions::HEIGHT,
						getColorReferenceLinear(),
						tcu::Sampler::MIRRORED_REPEAT_GL,
						tcu::Sampler::MIRRORED_REPEAT_GL,
						tcu::Sampler::LINEAR,
						tcu::Sampler::LINEAR,
						SRGBDECODE_DECODE);

	this->addShaderProgram(shaderParameters);

	this->setSamplingLocations(TestSamplingPositions::X_POS, TestSamplingPositions::Y_POS);

	this->setSamplingGroup(SHADERSAMPLINGGROUP_TEXTURE);
}